

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

void SuperSpread_Test_Speed<4u>(string *PATH)

{
  ulong uVar1;
  uint mem;
  ostream *poVar2;
  Data<4U> *pDVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  Data<4U> to;
  Data<4U> from;
  int cnt;
  int local_394;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string file;
  WavingSketch<8U,_16U,_4U> sketch;
  ofstream out;
  
  from.str[0] = '\0';
  from.str[1] = '\0';
  from.str[2] = '\0';
  from.str[3] = '\0';
  to.str[0] = '\0';
  to.str[1] = '\0';
  to.str[2] = '\0';
  to.str[3] = '\0';
  std::__cxx11::string::string((string *)&file,"caida",(allocator *)&out);
  std::operator+(&local_390,&RESULT_FOLDER_abi_cxx11_,"superSpread_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cnt,
                 &local_390,&file);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sketch,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cnt,
                 "_Throughput(Mops).csv");
  std::ofstream::ofstream(&out,(string *)&sketch,_S_out);
  std::__cxx11::string::~string((string *)&sketch);
  std::__cxx11::string::~string((string *)&cnt);
  std::__cxx11::string::~string((string *)&local_390);
  iVar6 = 0;
  while (iVar6 != 5) {
    mem = iVar6 * 100000 + 600000;
    uVar1 = (ulong)mem / 1000;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m",uVar1,(ulong)mem % 1000);
    if (iVar6 == 0) {
      poVar2 = std::operator<<((ostream *)&out,"MEM(KB)");
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = std::operator<<(poVar2,"WavingSketch<8,1>");
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = std::operator<<(poVar2,"TLF");
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = std::operator<<(poVar2,"OLF");
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = std::operator<<(poVar2,"opensketch");
      poVar2 = std::operator<<(poVar2,",");
      std::operator<<(poVar2,"SpreadSketch");
      std::endl<char,std::char_traits<char>>((ostream *)&out);
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&out,(int)uVar1);
    std::operator<<(poVar2,",");
    WavingSketch<8U,_16U,_4U>::WavingSketch(&sketch,mem,0x54,3);
    local_394 = iVar6;
    pDVar3 = read_standard_pair_data<4u>((PATH->_M_dataplus)._M_p,record_length,&cnt);
    lVar4 = std::chrono::_V2::system_clock::now();
    if (9999999 < cnt) {
      cnt = 10000000;
    }
    for (lVar7 = 0; lVar7 < cnt; lVar7 = lVar7 + 1) {
      from.str = *&pDVar3[lVar7 * 2].str;
      to.str = *&pDVar3[lVar7 * 2 + 1].str;
      WavingSketch<8U,_16U,_4U>::Init(&sketch,&from,&to);
    }
    lVar5 = std::chrono::_V2::system_clock::now();
    printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&sketch.super_Abstract<4U>.name);
    std::operator<<(poVar2,(string *)&sketch.super_Abstract<4U>.sep);
    dVar8 = (double)(int)lVar7 / ((double)(lVar5 - lVar4) / 1000.0);
    poVar2 = std::ostream::_M_insert<double>(dVar8);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::ostream::_M_insert<double>(dVar8);
    std::operator<<(poVar2,",");
    free(pDVar3);
    WavingSketch<8U,_16U,_4U>::~WavingSketch(&sketch);
    TLF<4U>::TLF((TLF<4U> *)&sketch,mem,0x54);
    pDVar3 = read_standard_pair_data<4u>((PATH->_M_dataplus)._M_p,record_length,&cnt);
    lVar4 = std::chrono::_V2::system_clock::now();
    if (9999999 < cnt) {
      cnt = 10000000;
    }
    for (lVar7 = 0; lVar7 < cnt; lVar7 = lVar7 + 1) {
      from.str = *&pDVar3[lVar7 * 2].str;
      to.str = *&pDVar3[lVar7 * 2 + 1].str;
      TLF<4U>::Init((TLF<4U> *)&sketch,&from,&to);
    }
    lVar5 = std::chrono::_V2::system_clock::now();
    printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&sketch.super_Abstract<4U>.name);
    std::operator<<(poVar2,(string *)&sketch.super_Abstract<4U>.sep);
    dVar8 = (double)(int)lVar7 / ((double)(lVar5 - lVar4) / 1000.0);
    poVar2 = std::ostream::_M_insert<double>(dVar8);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::ostream::_M_insert<double>(dVar8);
    std::operator<<(poVar2,",");
    free(pDVar3);
    TLF<4U>::~TLF((TLF<4U> *)&sketch);
    OLF<4U>::OLF((OLF<4U> *)&sketch,mem,0x54);
    pDVar3 = read_standard_pair_data<4u>((PATH->_M_dataplus)._M_p,record_length,&cnt);
    lVar4 = std::chrono::_V2::system_clock::now();
    if (9999999 < cnt) {
      cnt = 10000000;
    }
    for (lVar7 = 0; lVar7 < cnt; lVar7 = lVar7 + 1) {
      from.str = *&pDVar3[lVar7 * 2].str;
      to.str = *&pDVar3[lVar7 * 2 + 1].str;
      OLF<4U>::Init((OLF<4U> *)&sketch,&from,&to);
    }
    lVar5 = std::chrono::_V2::system_clock::now();
    printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&sketch.super_Abstract<4U>.name);
    std::operator<<(poVar2,(string *)&sketch.super_Abstract<4U>.sep);
    dVar8 = (double)(int)lVar7 / ((double)(lVar5 - lVar4) / 1000.0);
    poVar2 = std::ostream::_M_insert<double>(dVar8);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::ostream::_M_insert<double>(dVar8);
    std::operator<<(poVar2,",");
    free(pDVar3);
    OLF<4U>::~OLF((OLF<4U> *)&sketch);
    OpenSketch<4U>::OpenSketch((OpenSketch<4U> *)&sketch,mem,0x54);
    pDVar3 = read_standard_pair_data<4u>((PATH->_M_dataplus)._M_p,record_length,&cnt);
    lVar4 = std::chrono::_V2::system_clock::now();
    if (9999999 < cnt) {
      cnt = 10000000;
    }
    for (lVar7 = 0; lVar7 < cnt; lVar7 = lVar7 + 1) {
      from.str = *&pDVar3[lVar7 * 2].str;
      to.str = *&pDVar3[lVar7 * 2 + 1].str;
      OpenSketch<4U>::Init((OpenSketch<4U> *)&sketch,&from,&to);
    }
    lVar5 = std::chrono::_V2::system_clock::now();
    printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&sketch.super_Abstract<4U>.name);
    std::operator<<(poVar2,(string *)&sketch.super_Abstract<4U>.sep);
    dVar8 = (double)(int)lVar7 / ((double)(lVar5 - lVar4) / 1000.0);
    poVar2 = std::ostream::_M_insert<double>(dVar8);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::ostream::_M_insert<double>(dVar8);
    std::operator<<(poVar2,",");
    free(pDVar3);
    OpenSketch<4U>::~OpenSketch((OpenSketch<4U> *)&sketch);
    SpreadSketchWrapper<4U>::SpreadSketchWrapper((SpreadSketchWrapper<4U> *)&sketch,mem,0x54);
    pDVar3 = read_standard_pair_data<4u>((PATH->_M_dataplus)._M_p,record_length,&cnt);
    lVar4 = std::chrono::_V2::system_clock::now();
    if (9999999 < cnt) {
      cnt = 10000000;
    }
    for (lVar7 = 0; lVar7 < cnt; lVar7 = lVar7 + 1) {
      from.str = *&pDVar3[lVar7 * 2].str;
      to.str = *&pDVar3[lVar7 * 2 + 1].str;
      SpreadSketchWrapper<4U>::Init((SpreadSketchWrapper<4U> *)&sketch,&from,&to);
    }
    lVar5 = std::chrono::_V2::system_clock::now();
    printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&sketch.super_Abstract<4U>.name);
    std::operator<<(poVar2,(string *)&sketch.super_Abstract<4U>.sep);
    dVar8 = (double)(int)lVar7 / ((double)(lVar5 - lVar4) / 1000.0);
    poVar2 = std::ostream::_M_insert<double>(dVar8);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::ostream::_M_insert<double>(dVar8);
    std::operator<<(poVar2,",");
    free(pDVar3);
    SpreadSketchWrapper<4U>::~SpreadSketchWrapper((SpreadSketchWrapper<4U> *)&sketch);
    std::endl<char,std::char_traits<char>>((ostream *)&out);
    iVar6 = local_394 + 1;
  }
  std::ofstream::~ofstream(&out);
  std::__cxx11::string::~string((string *)&file);
  return;
}

Assistant:

void SuperSpread_Test_Speed(string PATH) {
	const int CYCLE = 1;
	Data<DATA_LEN> from;
	Data<DATA_LEN> to;
	std::string file = "caida";
	std::ofstream out(RESULT_FOLDER + "superSpread_" + file + "_Throughput(Mops).csv");
	for (int i = 0; i < 5; ++i) {
		int memory = 6 * SuperSpread_BLOCK + SuperSpread_BLOCK * i;
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m", memory / 1000);

		if (i == 0)
		{
			out << "MEM(KB)" << "," << "WavingSketch<8,1>" << "," << "TLF" << ","
				<< "OLF" << "," << "opensketch" << "," << "SpreadSketch";
			out << std::endl;
		}
		out << memory / 1000 << ",";

		for (int k = 0; k < CYCLE; ++k) {
			WavingSketch<8, 16, DATA_LEN> sketch(memory, SuperSpread_HIT);
			int cnt;
			Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
			int num = 0;

			TP start = now();
			cnt = std::min(cnt, MAX_PACKET);
			while (num < cnt) {
				from = records[num * 2];
				to = records[num * 2 + 1];
				++num;
				sketch.Init(from, to);
			}
			TP finish = now();

			double duration =
				(double)std::chrono::duration_cast<
				std::chrono::duration<double, std::ratio<1, 1000000>>>(finish -
					start)
				.count();
			printf("\033[0m\033[1;36m|\033[0m\t");
			cout << sketch.name << sketch.sep << (num + 0.0) / duration << endl;
			out << (num + 0.0) / duration << ",";
			free(records);
		}

		for (int k = 0; k < CYCLE; ++k) {
			TLF<DATA_LEN> sketch(memory, SuperSpread_HIT);
			int cnt;
			Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
			int num = 0;

			TP start = now();
			cnt = std::min(cnt, MAX_PACKET);
			while (num < cnt) {
				from = records[num * 2];
				to = records[num * 2 + 1];
				++num;
				sketch.Init(from, to);
			}
			TP finish = now();

			double duration =
				(double)std::chrono::duration_cast<
				std::chrono::duration<double, std::ratio<1, 1000000>>>(finish -
					start)
				.count();
			printf("\033[0m\033[1;36m|\033[0m\t");
			cout << sketch.name << sketch.sep << (num + 0.0) / duration << endl;
			out << (num + 0.0) / duration << ",";
			free(records);
		}

		for (int k = 0; k < CYCLE; ++k) {
			OLF<DATA_LEN> sketch(memory, SuperSpread_HIT);
			int cnt;
			Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
			int num = 0;

			TP start = now();
			cnt = std::min(cnt, MAX_PACKET);
			while (num < cnt) {
				from = records[num * 2];
				to = records[num * 2 + 1];
				++num;
				sketch.Init(from, to);
			}
			TP finish = now();

			double duration =
				(double)std::chrono::duration_cast<
				std::chrono::duration<double, std::ratio<1, 1000000>>>(finish -
					start)
				.count();
			printf("\033[0m\033[1;36m|\033[0m\t");
			cout << sketch.name << sketch.sep << (num + 0.0) / duration << endl;
			out << (num + 0.0) / duration << ",";
			free(records);
		}

		for (int k = 0; k < CYCLE; ++k) {
			OpenSketch<DATA_LEN> sketch(memory, SuperSpread_HIT);
			int cnt;
			Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
			int num = 0;

			TP start = now();
			cnt = std::min(cnt, MAX_PACKET);
			while (num < cnt) {
				from = records[num * 2];
				to = records[num * 2 + 1];
				++num;
				sketch.Init(from, to);
			}
			TP finish = now();

			double duration =
				(double)std::chrono::duration_cast<
				std::chrono::duration<double, std::ratio<1, 1000000>>>(finish -
					start)
				.count();
			printf("\033[0m\033[1;36m|\033[0m\t");
			cout << sketch.name << sketch.sep << (num + 0.0) / duration << endl;
			out << (num + 0.0) / duration << ",";
			free(records);
		}

		for (int k = 0; k < CYCLE; ++k) {
			SpreadSketchWrapper<DATA_LEN> sketch(memory, SuperSpread_HIT);
			int cnt;
			Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
			int num = 0;

			TP start = now();
			cnt = std::min(cnt, MAX_PACKET);
			while (num < cnt) {
				from = records[num * 2];
				to = records[num * 2 + 1];
				++num;
				sketch.Init(from, to);
			}
			TP finish = now();

			double duration =
				(double)std::chrono::duration_cast<
				std::chrono::duration<double, std::ratio<1, 1000000>>>(finish -
					start)
				.count();
			printf("\033[0m\033[1;36m|\033[0m\t");
			cout << sketch.name << sketch.sep << (num + 0.0) / duration << endl;
			out << (num + 0.0) / duration << ",";
			free(records);
		}
		out << endl;
	}
}